

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void filter_src_pixels_avx2
               (__m256i src,__m256i *horz_out,__m256i *coeff,__m256i *shuffle_src,
               __m256i *round_const,__m128i *shift,int row)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  long in_RDI;
  undefined1 (*in_R8) [16];
  int in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i res;
  __m256i res_odd;
  __m256i res_even;
  __m256i res_57;
  __m256i res_13;
  __m256i res_46;
  __m256i res_02;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpshufb_avx2(auVar1,*in_RDX);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar2 = vpshufb_avx2(auVar2,in_RDX[1]);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar3 = vpshufb_avx2(auVar3,in_RDX[2]);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar4 = vpshufb_avx2(auVar4,in_RDX[3]);
  auVar1 = vpmaddubsw_avx2(auVar1,*in_RSI);
  auVar2 = vpmaddubsw_avx2(auVar2,in_RSI[1]);
  auVar3 = vpmaddubsw_avx2(auVar3,in_RSI[2]);
  auVar4 = vpmaddubsw_avx2(auVar4,in_RSI[3]);
  auVar1 = vpaddw_avx2(auVar1,auVar2);
  auVar2 = vpaddw_avx2(auVar3,auVar4);
  auVar1 = vpaddw_avx2(auVar1,auVar2);
  auVar1 = vpaddw_avx2(auVar1,*in_RCX);
  auVar1 = vpsrlw_avx2(auVar1,*in_R8);
  *(undefined1 (*) [32])(in_RDI + (long)in_R9D * 0x20) = auVar1;
  return;
}

Assistant:

static inline void filter_src_pixels_avx2(const __m256i src, __m256i *horz_out,
                                          __m256i *coeff,
                                          const __m256i *shuffle_src,
                                          const __m256i *round_const,
                                          const __m128i *shift, int row) {
  const __m256i src_0 = _mm256_shuffle_epi8(src, shuffle_src[0]);
  const __m256i src_1 = _mm256_shuffle_epi8(src, shuffle_src[1]);
  const __m256i src_2 = _mm256_shuffle_epi8(src, shuffle_src[2]);
  const __m256i src_3 = _mm256_shuffle_epi8(src, shuffle_src[3]);

  const __m256i res_02 = _mm256_maddubs_epi16(src_0, coeff[0]);
  const __m256i res_46 = _mm256_maddubs_epi16(src_1, coeff[1]);
  const __m256i res_13 = _mm256_maddubs_epi16(src_2, coeff[2]);
  const __m256i res_57 = _mm256_maddubs_epi16(src_3, coeff[3]);

  const __m256i res_even = _mm256_add_epi16(res_02, res_46);
  const __m256i res_odd = _mm256_add_epi16(res_13, res_57);
  const __m256i res =
      _mm256_add_epi16(_mm256_add_epi16(res_even, res_odd), *round_const);
  horz_out[row] = _mm256_srl_epi16(res, *shift);
}